

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

void __thiscall Sudoku::permuteNumbers(Sudoku *this)

{
  Field *this_00;
  int iVar1;
  long lVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> permutation;
  allocator_type local_a1;
  vector<int,_std::allocator<int>_> local_a0;
  int local_84 [25];
  
  piVar4 = &DAT_001221a4;
  piVar5 = local_84;
  for (lVar2 = 0x19; lVar2 != 0; lVar2 = lVar2 + -1) {
    *piVar5 = *piVar4;
    piVar4 = piVar4 + 1;
    piVar5 = piVar5 + 1;
  }
  __l._M_len = 0x19;
  __l._M_array = local_84;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l,&local_a1);
  if (0 < this->squared_size_) {
    uVar3 = 0;
    do {
      if (0 < this->squared_size_) {
        uVar7 = 0;
        do {
          iVar1 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar3,uVar7);
          iVar1 = Field::value((this->fields_).
                               super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar1].
                               super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (0 < iVar1) {
            iVar1 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar3,uVar7);
            this_00 = (this->fields_).
                      super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar1].
                      super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar1 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar3,uVar7);
            iVar1 = Field::value((this->fields_).
                                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                 super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            Field::setValue(this_00,local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[(long)iVar1 + -1]);
          }
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
        } while ((int)uVar6 < this->squared_size_);
      }
      uVar3 = uVar3 + 1;
    } while ((int)uVar3 < this->squared_size_);
  }
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Sudoku::permuteNumbers()
{
  //generate random permutation
  //srand(std::time(NULL));
  //std::vector<int> permutation(squared_size_) = {21, 8, 1, 19, 14, 10, 4, 18, 24, 5, 16, 9, 3, 7, 6, 22};
  //std::vector<int> permutation = {21, 8, 1, 19, 14, 10, 4, 18, 24, 5, 16, 9, 3, 7, 6, 22, };
  //                              1, 2,  3,  4,  5, 6,  7,  8, 9, 10, 11, 12, 13,14, 15, 16, 17,18,19, 20,21, 22, 23,24, 25
  std::vector<int> permutation = {3, 24, 13, 7, 10, 15, 14, 2, 12, 6, 22, 21, 13, 5, 15, 11, 17, 8, 4, 20, 1, 16, 23, 9, 25};

  if(false)
  {
    for(int i=0; i<squared_size_; i++)
    {
      permutation[i] = i+1;
    }

    for(int i=0; i<squared_size_; i++)
    {
      int index = rand() % (squared_size_-i) + i;
      std::swap(permutation[i], permutation[index]);
    }
  }

  // apply permutation
  for(int x = 0; x < squared_size_; x++)
  {
    for (int y = 0; y < squared_size_; y++)
    {
      if(fields_[index(x,y)]->value() > 0)
        fields_[index(x,y)]->setValue(permutation[fields_[index(x,y)]->value()-1]);
    }
  }
}